

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

int ON_MeshComponentRef::Compare(ON_MeshComponentRef *lhs,ON_MeshComponentRef *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  iVar1 = 1;
  if ((lhs != (ON_MeshComponentRef *)0x0) && (iVar1 = -1, rhs != (ON_MeshComponentRef *)0x0)) {
    if ((rhs->m_mesh <= lhs->m_mesh) && (iVar1 = 1, lhs->m_mesh <= rhs->m_mesh)) {
      iVar1 = ON_COMPONENT_INDEX::Compare(&lhs->m_mesh_ci,&rhs->m_mesh_ci);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int ON_MeshComponentRef::Compare(const ON_MeshComponentRef* lhs, const ON_MeshComponentRef* rhs)
{
  if (lhs == rhs)
    return 0;

  // nullptrs are last
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  const ON__UINT_PTR lhs_ptr = (ON__UINT_PTR)lhs->m_mesh;
  const ON__UINT_PTR rhs_ptr = (ON__UINT_PTR)rhs->m_mesh;
  if (lhs_ptr < rhs_ptr)
    return -1;
  if (lhs_ptr > rhs_ptr)
    return 1;

  return ON_COMPONENT_INDEX::Compare(&lhs->m_mesh_ci, &rhs->m_mesh_ci);
}